

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

void __thiscall ON_Viewport::GetViewScale(ON_Viewport *this,double *x,double *y,double *z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  undefined4 uVar7;
  undefined7 extraout_var;
  int iVar8;
  
  uVar7 = SUB84(z,0);
  if (x != (double *)0x0) {
    *x = 1.0;
  }
  if (y != (double *)0x0) {
    *y = 1.0;
  }
  if (z != (double *)0x0) {
    *z = 1.0;
  }
  bVar6 = ON_Xform::IsIdentity(&this->m_clip_mods,0.0);
  auVar4._4_4_ = -(uint)((this->m_clip_mods).m_xform[3][1] != 0.0);
  auVar4._0_4_ = -(uint)((this->m_clip_mods).m_xform[3][0] != 0.0);
  auVar4._8_4_ = -(uint)((this->m_clip_mods).m_xform[3][2] != 0.0);
  auVar4._12_4_ = -(uint)((this->m_clip_mods).m_xform[3][3] != 1.0);
  iVar8 = movmskps(uVar7,auVar4);
  if ((iVar8 == 0) && (!bVar6)) {
    dVar1 = (this->m_clip_mods).m_xform[0][0];
    if ((2.3283064365386963e-10 < ABS(dVar1)) &&
       (((auVar5._4_4_ = -(uint)((this->m_clip_mods).m_xform[0][2] != 0.0),
         auVar5._0_4_ = -(uint)((this->m_clip_mods).m_xform[0][1] != 0.0),
         auVar5._8_4_ = -(uint)((this->m_clip_mods).m_xform[1][0] != 0.0),
         auVar5._12_4_ = -(uint)((this->m_clip_mods).m_xform[1][2] != 0.0),
         uVar7 = movmskps((int)CONCAT71(extraout_var,bVar6),auVar5), (char)uVar7 == '\0' &&
         (dVar2 = (this->m_clip_mods).m_xform[1][1], 2.3283064365386963e-10 < ABS(dVar2))) &&
        (dVar3 = (this->m_clip_mods).m_xform[2][2], 2.3283064365386963e-10 < ABS(dVar3))))) {
      if (x != (double *)0x0) {
        *x = dVar1;
      }
      if (y != (double *)0x0) {
        *y = dVar2;
      }
      if (z != (double *)0x0) {
        *z = dVar3;
      }
    }
  }
  return;
}

Assistant:

void ON_Viewport::GetViewScale( double* x, double* y, double* z) const
{
  if (x) *x = 1.0;
  if (y) *y = 1.0;
  if (z) *z = 1.0;
  if ( !m_clip_mods.IsIdentity()
       && 0.0 == m_clip_mods.m_xform[3][0]
       && 0.0 == m_clip_mods.m_xform[3][1]
       && 0.0 == m_clip_mods.m_xform[3][2]
       && 1.0 == m_clip_mods.m_xform[3][3]
     )
  {
    // 04 May 2020 S. Baer (RH-37076)
    // Allow for negative scale values. See comments in SetViewScale
    double sx = m_clip_mods.m_xform[0][0];
    double sy = m_clip_mods.m_xform[1][1];
    double sz = m_clip_mods.m_xform[2][2];
    if (    fabs(sx) > ON_ZERO_TOLERANCE
         && fabs(sy) > ON_ZERO_TOLERANCE
         && fabs(sz) > ON_ZERO_TOLERANCE
         && 0.0 == m_clip_mods.m_xform[0][1]
         && 0.0 == m_clip_mods.m_xform[0][2]
         && 0.0 == m_clip_mods.m_xform[1][0]
         && 0.0 == m_clip_mods.m_xform[1][2]
      )
    {
      if (x) *x = sx;
      if (y) *y = sy;
      if (z) *z = sz;
    }
  }
}